

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_all_gather_sparse_vec.c
# Opt level: O1

int all_gather_sparse_vec(float *dense,int n_over_p,float **sparse_out,int **sparse_ivec_out)

{
  bsp_pid_t bVar1;
  bsp_pid_t bVar2;
  float *pfVar3;
  int *piVar4;
  ulong uVar5;
  int *tag;
  size_t __nmemb;
  long lVar6;
  float *payload;
  int nonzeros;
  int status;
  int tag_size;
  int global_idx;
  int nonzeros_size;
  int local_64;
  int local_60;
  uint local_5c [3];
  float **local_50;
  int **local_48;
  ulong local_40;
  bsp_size_t local_34;
  
  local_50 = sparse_out;
  local_48 = sparse_ivec_out;
  bVar1 = bsp_nprocs();
  local_5c[1] = 4;
  bsp_set_tagsize((bsp_size_t *)(local_5c + 1));
  bsp_sync();
  local_60 = n_over_p;
  if (0 < n_over_p) {
    local_40 = (ulong)(uint)n_over_p;
    uVar5 = 0;
    do {
      if ((dense[uVar5] != 0.0) || (NAN(dense[uVar5]))) {
        bVar2 = bsp_pid();
        local_5c[2] = bVar2 * local_60 + (int)uVar5;
        if (0 < bVar1) {
          bVar2 = 0;
          do {
            bsp_send(bVar2,local_5c + 2,dense + uVar5,4);
            bVar2 = bVar2 + 1;
          } while (bVar1 != bVar2);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_40);
  }
  bsp_sync();
  bsp_qsize(&local_64,&local_34);
  __nmemb = (size_t)local_64;
  if ((long)__nmemb < 1) {
    piVar4 = (int *)0x0;
    pfVar3 = (float *)0x0;
  }
  else {
    pfVar3 = (float *)calloc(__nmemb,4);
    piVar4 = (int *)calloc(__nmemb,4);
    if (pfVar3 == (float *)0x0 || piVar4 == (int *)0x0) {
      bsp_abort("Unable to allocate memory\n");
    }
    if (0 < local_64) {
      lVar6 = 0;
      tag = piVar4;
      payload = pfVar3;
      do {
        bsp_get_tag((bsp_size_t *)local_5c,tag);
        if (local_5c[0] != 4) {
          printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_all_gather_sparse_vec.c:%d\n"
                 ,"status","(int) sizeof(float)",4,(ulong)local_5c[0],0x25);
          abort();
        }
        bsp_move(payload,4);
        lVar6 = lVar6 + 1;
        payload = payload + 1;
        tag = tag + 1;
      } while (lVar6 < local_64);
    }
  }
  bsp_set_tagsize((bsp_size_t *)(local_5c + 1));
  *local_50 = pfVar3;
  *local_48 = piVar4;
  return local_64;
}

Assistant:

int all_gather_sparse_vec( float * dense, int n_over_p,
                            float ** sparse_out,
                            int ** sparse_ivec_out) {
   int global_idx, i, j, tag_size, p, 
       nonzeros, nonzeros_size, status;
   int *sparse_ivec = NULL;
   float *sparse = NULL;

   p = bsp_nprocs();
   tag_size = sizeof(int);
   bsp_set_tagsize(&tag_size);
   bsp_sync();

   for ( i = 0; i < n_over_p; ++i ) {
     if ( dense[i] != 0.0 ) {
       global_idx = n_over_p * bsp_pid() + i;
       for (j = 0; j < p; ++j)
         bsp_send(j, &global_idx, &dense[i], sizeof(float) );
     }
   }
   bsp_sync();

   bsp_qsize( &nonzeros, &nonzeros_size );
   if (nonzeros > 0 ) {
     sparse      = calloc( nonzeros, sizeof(float) );
     sparse_ivec = calloc( nonzeros, sizeof(int) );
     if (sparse == NULL || sparse_ivec == NULL)
       bsp_abort("Unable to allocate memory\n");
 
     for ( i = 0 ; i < nonzeros; ++i) {
       bsp_get_tag( &status, &sparse_ivec[i] );
       EXPECT_EQ( "%d", status, (int) sizeof(float));
       bsp_move( &sparse[i], sizeof(float) );
     }
   }
   bsp_set_tagsize(&tag_size);
   *sparse_out = sparse;
   *sparse_ivec_out = sparse_ivec;
   return nonzeros;
}